

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  EVP_PKEY_CTX *in_RDX;
  bool bVar2;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  bVar2 = ((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 5) == 0;
  EVar1 = this[0x181];
  if ((bVar2 == (bool)((byte)EVar1 & 1)) || (*(char *)(g_cs + 0x74) == '\x01')) {
    String::String((String *)&local_30.data,"{?}");
    Result::Result(__return_storage_ptr__,(bool)((bVar2 ^ (byte)EVar1) & 1),(String *)&local_30.data
                  );
  }
  else {
    local_30.buf[0] = '\0';
    local_30.buf[0x17] = '\x17';
    __return_storage_ptr__->m_passed = true;
    String::copy(&__return_storage_ptr__->m_decomp,(EVP_PKEY_CTX *)&local_30.data,in_RDX);
  }
  String::~String((String *)&local_30.data);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }